

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O1

int __thiscall GrcManager::CalculateSilfVersion(GrcManager *this,int fxdSilfSpecVersion)

{
  GdlGlyphClassDefn *pGVar1;
  void *pvVar2;
  bool bVar3;
  pointer ppGVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vwGlyphs;
  vector<int,_std::allocator<int>_> vnIndices;
  void *local_108;
  long lStack_100;
  long local_f8;
  int local_f0;
  int local_ec;
  void *local_e8;
  undefined8 uStack_e0;
  long local_d8;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar6 = 0x50000;
  if (0x50000 < fxdSilfSpecVersion) {
    iVar6 = fxdSilfSpecVersion;
  }
  if (this->m_tcCompressor == ktcNone) {
    iVar6 = fxdSilfSpecVersion;
  }
  bVar3 = GdlRenderer::HasCollisionPass(this->m_prndr);
  iVar5 = 0x40001;
  if (0x40001 < iVar6) {
    iVar5 = iVar6;
  }
  if (!bVar3) {
    iVar5 = iVar6;
  }
  iVar6 = 0x40000;
  if (0x40000 < iVar5) {
    iVar6 = iVar5;
  }
  if (this->m_fPassOptimizations == false) {
    iVar6 = iVar5;
  }
  if (iVar6 < 0x40000) {
    uVar7 = ((long)(this->m_vpglfcReplcmtClasses).
                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vpglfcReplcmtClasses).
                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2) + 6;
    iVar5 = this->m_cpglfcLinear;
    local_ec = fxdSilfSpecVersion;
    if (0 < iVar5) {
      lVar9 = 0;
      do {
        pGVar1 = (this->m_vpglfcReplcmtClasses).
                 super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar9];
        local_108 = (void *)0x0;
        lStack_100 = 0;
        local_f8 = 0;
        (**(code **)((long)(pGVar1->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn + 0xb0))
                  (pGVar1,&local_108);
        pvVar2 = local_108;
        lVar8 = uVar7 + lStack_100;
        if (local_108 != (void *)0x0) {
          operator_delete(local_108,local_f8 - (long)local_108);
        }
        uVar7 = lVar8 - (long)pvVar2;
        lVar9 = lVar9 + 1;
        iVar5 = this->m_cpglfcLinear;
      } while (lVar9 < iVar5);
    }
    ppGVar4 = (this->m_vpglfcReplcmtClasses).
              super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_f0 = iVar6;
    if (iVar5 < (int)((ulong)((long)(this->m_vpglfcReplcmtClasses).
                                    super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar4) >> 3
                     )) {
      lVar9 = (long)iVar5;
      do {
        local_f8 = 0;
        local_108 = (void *)0x0;
        lStack_100 = 0;
        local_d8 = 0;
        local_e8 = (void *)0x0;
        uStack_e0 = 0;
        (**(code **)((long)(ppGVar4[lVar9]->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn +
                    0xb8))(ppGVar4[lVar9],&local_108,&local_e8);
        lVar8 = lStack_100 - (long)local_108;
        if (local_e8 != (void *)0x0) {
          operator_delete(local_e8,local_d8 - (long)local_e8);
        }
        if (local_108 != (void *)0x0) {
          operator_delete(local_108,local_f8 - (long)local_108);
        }
        uVar7 = uVar7 + 8 + lVar8 * 2;
        lVar9 = lVar9 + 1;
        ppGVar4 = (this->m_vpglfcReplcmtClasses).
                  super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (lVar9 < (int)((ulong)((long)(this->m_vpglfcReplcmtClasses).
                                           super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppGVar4) >> 3));
    }
    fxdSilfSpecVersion = local_ec;
    iVar6 = local_f0;
    if (0xffff < uVar7) {
      iVar6 = 0x40000;
    }
  }
  if ((fxdSilfSpecVersion < iVar6) && (this->m_fUserSpecifiedVersion == true)) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Version ","");
    VersionString_abi_cxx11_(&local_70,fxdSilfSpecVersion);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,
               " of the Silf table is inadequate for your specification; version ","");
    VersionString_abi_cxx11_(&local_50,iVar6);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90," will be generated instead.","");
    GrcErrorList::AddItem
              (&g_errorList,false,0x1580,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_d0,&local_70,
               &local_b0,&local_50,&local_90,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  this->m_fxdSilfTableVersion = iVar6;
  return iVar6;
}

Assistant:

int GrcManager::CalculateSilfVersion(int fxdSilfSpecVersion)
{
	int fxdResult = fxdSilfSpecVersion;

	if (m_tcCompressor != ktcNone && fxdResult < 0x00050000)
	{
	    fxdResult = 0x00050000;
	}
	if (m_prndr->HasCollisionPass() && fxdResult < 0x00040001)
	{
		fxdResult = 0x00040001;
	}
	if (this->IncludePassOptimizations() && fxdResult < 0x00040000)
	{
		// Although earlier versions of the Silf table have space for the skip-passes attribute,
		// OTS will complain if the value is anything other than zero. So bump up the version
		// to match.
		fxdResult = 0x00040000;
	}
	if (fxdResult < 0x00040000)
	{
		//	Calculate it based on what is needed to handle the size of the class map
		//	(replacement class data).
		size_t cbSpaceNeeded;	// # of bytes needed = max offset

		//	number of classes
		cbSpaceNeeded = 4;

		//	the offsets to classes themselves, assuming short ints
		cbSpaceNeeded += (m_vpglfcReplcmtClasses.size() + 1) * 2;

		//	Space needed for the class glyph lists

		for (int ipglfc = 0; ipglfc < m_cpglfcLinear; ipglfc++)
		{
			GdlGlyphClassDefn * pglfc = m_vpglfcReplcmtClasses[ipglfc];

			Assert(pglfc->ReplcmtOutputClass() || pglfc->GlyphIDCount() <= 1);
			//Assert(pglfc->ReplcmtOutputID() == cTmp);

			std::vector<utf16> vwGlyphs;
			pglfc->GenerateOutputGlyphList(vwGlyphs);

			cbSpaceNeeded += vwGlyphs.size() * 2;
		}

		//	indexed classes (input)
		for (int ipglfc = m_cpglfcLinear; ipglfc < signed(m_vpglfcReplcmtClasses.size()); ipglfc++)
		{
			GdlGlyphClassDefn * pglfc = m_vpglfcReplcmtClasses[ipglfc];

			Assert(pglfc->ReplcmtInputClass());
			//Assert(pglfc->ReplcmtInputID() == cTmp);

			std::vector<utf16> vwGlyphs;
			std::vector<int> vnIndices;
			pglfc->GenerateInputGlyphList(vwGlyphs, vnIndices);
			int n = signed(vwGlyphs.size());
			cbSpaceNeeded += 8;	// search constants
			cbSpaceNeeded += vwGlyphs.size() * 4;
		}

		if (cbSpaceNeeded > 0xFFFF)
		{
			// Offsets won't all fit in short ints; we need long ints.
			fxdResult = 0x00040000;
		}
	}

	if (fxdResult > fxdSilfSpecVersion)
	{
		if (UserSpecifiedVersion())
			g_errorList.AddWarning(5504, NULL,
				"Version ",
				VersionString(fxdSilfSpecVersion),
				" of the Silf table is inadequate for your specification; version ",
				VersionString(fxdResult),
				" will be generated instead.");

//		else
//			g_errorList.AddWarning(5505, NULL,
//				"Version ",
//				VersionString(fxdResult),
//				" of the Silf table will be generated.");
	}

	SetTableVersion(ktiSilf, fxdResult);

	return fxdResult;
}